

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_walks.cpp
# Opt level: O3

size_t handlegraph::algorithms::count_walks(HandleGraph *graph)

{
  mapped_type *pmVar1;
  ulong uVar2;
  iterator __begin2;
  key_type *__k;
  tuple<std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
  to_receive;
  char in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  _Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  key_type *local_38;
  key_type *local_30;
  long local_28;
  
  count_walks_through_nodes
            ((HandleGraph *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88));
  uVar2 = 0xffffffffffffffff;
  if (in_stack_ffffffffffffff88 == '\0') {
    uVar2 = 0;
    for (__k = local_38; __k != local_30; __k = __k + 1) {
      pmVar1 = std::__detail::
               _Map_base<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_70,__k);
      if (CARRY8(*pmVar1,uVar2)) {
        uVar2 = 0xffffffffffffffff;
        break;
      }
      pmVar1 = std::__detail::
               _Map_base<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_70,__k);
      uVar2 = uVar2 + *pmVar1;
    }
  }
  if (local_38 != (key_type *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  std::
  _Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_70);
  return uVar2;
}

Assistant:

size_t count_walks(const HandleGraph* graph){
    
    tuple<vector<handle_t>, unordered_map<handle_t, size_t>, bool>  to_receive = count_walks_through_nodes(graph);
    
    vector<handle_t>& sinks = get<0>(to_receive);
    unordered_map<handle_t, size_t>& count = get<1>(to_receive);
    bool& overflowed = get<2>(to_receive);
    
    if (overflowed) {
        return numeric_limits<size_t>::max();
    }
    
    // total up the walks at the sinks
    size_t total_count = 0;
    for (handle_t& sink : sinks) {
        if (numeric_limits<size_t>::max() - total_count < count[sink]) {
            return numeric_limits<size_t>::max();
        }
        total_count += count[sink];
    }
    return total_count;
}